

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void strftimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  char cVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  ulong uVar5;
  char cVar6;
  int iVar7;
  void *pvVar8;
  char c;
  uint uVar9;
  ulong uVar10;
  int iVar12;
  undefined1 *puVar13;
  char *pcVar14;
  char *pcVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  undefined4 uVar17;
  undefined1 local_e8 [16];
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  double local_c8;
  ulong uStack_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [12];
  uint uStack_8c;
  undefined8 local_88;
  undefined1 *puStack_80;
  double local_78;
  undefined1 *puStack_70;
  undefined1 local_68 [12];
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined1 *puStack_50;
  double local_48;
  ulong uStack_40;
  long local_38;
  ulong uVar11;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffff70 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  if ((argc != 0) && (pvVar8 = sqlite3ValueText(*argv,'\x01'), pvVar8 != (void *)0x0)) {
    local_78 = -NAN;
    iVar7 = isDate(context,argc + -1,argv + 1,(DateTime *)local_98);
    if (iVar7 == 0) {
      local_b8._20_4_ = context->pOut->db->aLimit[0];
      local_b8._16_4_ = 0;
      local_b8._0_8_ = (sqlite3 *)0x0;
      local_b8._8_8_ = (char *)0x0;
      local_b8._24_8_ = local_b8._24_8_ & 0xffff000000000000;
      computeJD((DateTime *)local_98);
      computeYMD((DateTime *)local_98);
      computeHMS((DateTime *)local_98);
      uVar16 = 0;
      uVar10 = 0;
      while( true ) {
        if (*(char *)((long)pvVar8 + uVar10) != '%') break;
        if (uVar16 < uVar10) {
          sqlite3_str_append((sqlite3_str *)local_b8,(char *)((long)pvVar8 + uVar16),
                             (int)uVar10 - (int)uVar16);
        }
        uVar5 = uStack_40;
        uVar11 = uVar10 + 1;
        cVar1 = *(char *)((long)pvVar8 + uVar10 + 1);
        uVar16 = uVar10 + 2;
        uStack_40._0_1_ = (byte)puStack_70;
        uStack_40._2_6_ = (undefined6)((ulong)puStack_70 >> 0x10);
        uStack_40 = uVar5;
        switch(cVar1) {
        case 'F':
          pcVar14 = "%04d-%02d-%02d";
          uVar9 = uStack_8c;
          uVar2 = local_98._8_4_;
          uVar4 = (uint)local_88;
          goto LAB_001b5261;
        case 'G':
        case 'g':
          stack0xffffffffffffffa0 = stack0xffffffffffffff70;
          local_48 = local_78;
          local_58 = local_88;
          puStack_50 = puStack_80;
          iVar7 = (int)((long)(local_98._0_8_ + 43200000) / 86400000);
          local_68._0_8_ =
               local_98._0_8_ +
               (long)(int)((((uint)((ulong)((long)iVar7 * 0x92492493) >> 0x22) - (iVar7 >> 0x1f)) *
                            7 - iVar7) * 86400000 + 0xf731400);
          uStack_40._0_2_ = (ushort)(byte)uStack_40;
          computeYMD((DateTime *)local_68);
          uVar9 = local_68._8_4_;
          if (cVar1 != 'g') goto LAB_001b4e3e;
          uVar10 = (ulong)(uint)((int)local_68._8_4_ % 100);
          goto LAB_001b5226;
        case 'H':
        case 'k':
          pcVar14 = "%2d";
          if (cVar1 == 'H') {
            pcVar14 = "%02d";
          }
          uVar10 = (ulong)local_88._4_4_;
          goto LAB_001b5230;
        case 'I':
        case 'l':
          uVar9 = local_88._4_4_ - 0xc;
          if ((int)local_88._4_4_ < 0xd) {
            uVar9 = local_88._4_4_;
          }
          if (uVar9 == 0) {
            uVar9 = 0xc;
          }
          uVar10 = (ulong)uVar9;
          pcVar14 = "%2d";
          if (cVar1 == 'I') {
            pcVar14 = "%02d";
          }
          goto LAB_001b5230;
        case 'J':
          uVar17 = SUB84((double)(long)local_98._0_8_ / 86400000.0,0);
          pcVar14 = "%.16g";
          goto LAB_001b5323;
        case 'K':
        case 'L':
        case 'N':
        case 'O':
        case 'Q':
        case 'X':
        case 'Z':
        case '[':
        case '\\':
        case ']':
        case '^':
        case '_':
        case '`':
        case 'a':
        case 'b':
        case 'c':
        case 'h':
        case 'i':
        case 'n':
        case 'o':
        case 'q':
        case 'r':
        case 't':
        case 'v':
          goto switchD_001b4c35_caseD_4b;
        case 'M':
          uVar10 = (ulong)puStack_80 & 0xffffffff;
          goto LAB_001b5226;
        case 'P':
        case 'p':
          uVar10 = local_b8._24_8_ & 0xffffffff;
          if ((int)local_88._4_4_ < 0xc) {
            pcVar14 = "am";
            pcVar15 = "AM";
          }
          else {
            pcVar14 = "pm";
            pcVar15 = "PM";
          }
          if (cVar1 == 'p') {
            pcVar14 = pcVar15;
          }
          if (local_b8._24_4_ + 2 < (uint)local_b8._16_4_) {
            local_b8._24_4_ = local_b8._24_4_ + 2;
            *(undefined2 *)(local_b8._8_8_ + uVar10) = *(undefined2 *)pcVar14;
          }
          else {
            enlargeAndAppend((sqlite3_str *)local_b8,pcVar14,2);
          }
          break;
        case 'R':
          sqlite3_str_appendf((sqlite3_str *)local_b8,"%02d:%02d",(ulong)local_88._4_4_,
                              (ulong)puStack_80 & 0xffffffff);
          break;
        case 'S':
          uVar10 = (ulong)(uint)(int)local_78;
          goto LAB_001b5226;
        case 'T':
          pcVar14 = "%02d:%02d:%02d";
          uVar9 = (uint)puStack_80;
          uVar2 = local_88._4_4_;
          uVar4 = (int)local_78;
LAB_001b5261:
          sqlite3_str_appendf((sqlite3_str *)local_b8,pcVar14,(ulong)uVar2,(ulong)uVar9,(ulong)uVar4
                             );
          break;
        case 'U':
          local_48 = local_78;
          local_68._0_8_ = local_98._0_8_;
          puStack_50 = puStack_80;
          uStack_40 = (ulong)puStack_70 & 0xffffffffffffff00;
          stack0xffffffffffffffa0 = (undefined1 *)CONCAT44(1,local_98._8_4_);
          local_58 = (undefined1 *)CONCAT44(local_88._4_4_,1);
          computeJD((DateTime *)local_68);
          iVar7 = (int)(SUB168(SEXT816((long)(local_98._0_8_ + (43200000 - local_68._0_8_))) *
                               SEXT816(0x636ba875fd33dc87),8) >> 0x19) -
                  (SUB164(SEXT816((long)(local_98._0_8_ + (43200000 - local_68._0_8_))) *
                          SEXT816(0x636ba875fd33dc87),0xc) >> 0x1f);
          puVar13 = (undefined1 *)(local_98._0_8_ + 0x7b98a00);
          goto LAB_001b5069;
        case 'V':
          local_e8._8_8_ = stack0xffffffffffffff70;
          local_c8 = local_78;
          local_d8 = local_88;
          puStack_d0 = puStack_80;
          iVar7 = (int)((long)(local_98._0_8_ + 43200000) / 86400000);
          local_e8._0_8_ =
               local_98._0_8_ +
               (long)(int)((((uint)((ulong)((long)iVar7 * 0x92492493) >> 0x22) - (iVar7 >> 0x1f)) *
                            7 - iVar7) * 86400000 + 0xf731400);
          uStack_c0 = CONCAT62(uStack_40._2_6_,(ushort)(byte)uStack_40);
          computeYMD((DateTime *)local_e8);
          local_48 = local_c8;
          local_68._0_8_ = local_e8._0_8_;
          puStack_50 = puStack_d0;
          uStack_40 = uStack_c0 & 0xffffffffffffff00;
          local_68._8_4_ = (undefined4)local_e8._8_8_;
          stack0xffffffffffffffa0 = (undefined1 *)CONCAT44(1,local_68._8_4_);
          local_58 = (undefined1 *)CONCAT44((int)((ulong)local_d8 >> 0x20),1);
          computeJD((DateTime *)local_68);
          uVar10 = (ulong)((int)((long)(local_e8._0_8_ + (43200000 - local_68._0_8_)) / 86400000) /
                           7 + 1);
          goto LAB_001b5226;
        case 'W':
          local_48 = local_78;
          local_68._0_8_ = local_98._0_8_;
          puStack_50 = puStack_80;
          uStack_40 = (ulong)puStack_70 & 0xffffffffffffff00;
          stack0xffffffffffffffa0 = (undefined1 *)CONCAT44(1,local_98._8_4_);
          local_58 = (undefined1 *)CONCAT44(local_88._4_4_,1);
          computeJD((DateTime *)local_68);
          puVar13 = (undefined1 *)(local_98._0_8_ + 43200000);
          auVar3 = SEXT816((long)puVar13 - local_68._0_8_) * SEXT816(0x636ba875fd33dc87);
          iVar7 = (int)(auVar3._8_8_ >> 0x19) - (auVar3._12_4_ >> 0x1f);
LAB_001b5069:
          iVar12 = (int)((long)puVar13 / 86400000);
          iVar12 = (iVar12 / 7) * 7 - iVar12;
          iVar7 = (int)((ulong)((long)(iVar7 + iVar12 + 7) * -0x6db6db6d) >> 0x20) + iVar7 + iVar12
                  + 7;
          uVar10 = (ulong)(uint)((iVar7 >> 2) - (iVar7 >> 0x1f));
          goto LAB_001b5226;
        case 'Y':
          uVar9 = local_98._8_4_;
LAB_001b4e3e:
          uVar10 = (ulong)uVar9;
          pcVar14 = "%04d";
          goto LAB_001b5230;
        case 'd':
        case 'e':
          pcVar14 = "%2d";
          if (cVar1 == 'd') {
            pcVar14 = "%02d";
          }
          uVar10 = (ulong)local_88 & 0xffffffff;
          goto LAB_001b5230;
        case 'f':
          uVar17 = 0x3b645a1d;
          if (local_78 <= 59.999) {
            uVar17 = SUB84(local_78,0);
          }
          pcVar14 = "%06.3f";
LAB_001b5323:
          sqlite3_str_appendf((sqlite3_str *)local_b8,pcVar14,uVar17);
          break;
        case 'j':
          local_48 = local_78;
          local_68._0_8_ = local_98._0_8_;
          puStack_50 = puStack_80;
          uStack_40 = (ulong)puStack_70 & 0xffffffffffffff00;
          stack0xffffffffffffffa0 = (undefined1 *)CONCAT44(1,local_98._8_4_);
          local_58 = (undefined1 *)CONCAT44(local_88._4_4_,1);
          computeJD((DateTime *)local_68);
          uVar10 = (ulong)(((int)(SUB168(SEXT816((long)(local_98._0_8_ + (43200000 - local_68._0_8_)
                                                       )) * SEXT816(0x636ba875fd33dc87),8) >> 0x19)
                           - (SUB164(SEXT816((long)(local_98._0_8_ + (43200000 - local_68._0_8_))) *
                                     SEXT816(0x636ba875fd33dc87),0xc) >> 0x1f)) + 1);
          pcVar14 = "%03d";
          goto LAB_001b5230;
        case 'm':
          uVar10 = (ulong)uStack_8c;
LAB_001b5226:
          pcVar14 = "%02d";
LAB_001b5230:
          sqlite3_str_appendf((sqlite3_str *)local_b8,pcVar14,uVar10);
          break;
        case 's':
          if (((ulong)puStack_70 & 0x400000000) != 0) {
            uVar17 = SUB84((double)(long)(local_98._0_8_ + -0xbfc83e532200) / 1000.0,0);
            pcVar14 = "%.3f";
            goto LAB_001b5323;
          }
          sqlite3_str_appendf((sqlite3_str *)local_b8,"%lld",
                              (long)local_98._0_8_ / 1000 + -0x3118a36940);
          break;
        case 'u':
        case 'w':
          iVar7 = (int)((long)(local_98._0_8_ + 0x7b98a00) / 86400000) % 7;
          cVar6 = (char)iVar7 + '0';
          c = cVar6;
          if (iVar7 == 0) {
            c = '7';
          }
          if (cVar1 != 'u') {
            c = cVar6;
          }
LAB_001b4e30:
          sqlite3_str_appendchar((sqlite3_str *)local_b8,1,c);
          break;
        default:
          if (cVar1 == '%') {
            c = '%';
            goto LAB_001b4e30;
          }
          goto switchD_001b4c35_caseD_4b;
        }
LAB_001b523a:
        uVar10 = uVar11 + 1;
      }
      uVar11 = uVar10;
      if (*(char *)((long)pvVar8 + uVar10) != '\0') goto LAB_001b523a;
      if (uVar16 < uVar10) {
        sqlite3_str_append((sqlite3_str *)local_b8,(char *)((long)pvVar8 + uVar16),
                           (int)uVar10 - (int)uVar16);
      }
      sqlite3ResultStrAccum(context,(StrAccum *)local_b8);
    }
  }
LAB_001b5359:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
switchD_001b4c35_caseD_4b:
  if (((local_b8._24_8_ & 0x40000000000) != 0) && ((char *)local_b8._8_8_ != (char *)0x0)) {
    sqlite3DbFreeNN((sqlite3 *)local_b8._0_8_,(void *)local_b8._8_8_);
  }
  goto LAB_001b5359;
}

Assistant:

static void strftimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  size_t i,j;
  sqlite3 *db;
  const char *zFmt;
  sqlite3_str sRes;


  if( argc==0 ) return;
  zFmt = (const char*)sqlite3_value_text(argv[0]);
  if( zFmt==0 || isDate(context, argc-1, argv+1, &x) ) return;
  db = sqlite3_context_db_handle(context);
  sqlite3StrAccumInit(&sRes, 0, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);

  computeJD(&x);
  computeYMD_HMS(&x);
  for(i=j=0; zFmt[i]; i++){
    char cf;
    if( zFmt[i]!='%' ) continue;
    if( j<i ) sqlite3_str_append(&sRes, zFmt+j, (int)(i-j));
    i++;
    j = i + 1;
    cf = zFmt[i];
    switch( cf ){
      case 'd':  /* Fall thru */
      case 'e': {
        sqlite3_str_appendf(&sRes, cf=='d' ? "%02d" : "%2d", x.D);
        break;
      }
      case 'f': {  /* Fractional seconds.  (Non-standard) */
        double s = x.s;
        if( NEVER(s>59.999) ) s = 59.999;
        sqlite3_str_appendf(&sRes, "%06.3f", s);
        break;
      }
      case 'F': {
        sqlite3_str_appendf(&sRes, "%04d-%02d-%02d", x.Y, x.M, x.D);
        break;
      }
      case 'G': /* Fall thru */
      case 'g': {
        DateTime y = x;
        assert( y.validJD );
        /* Move y so that it is the Thursday in the same week as x */
        y.iJD += (3 - daysAfterMonday(&x))*86400000;
        y.validYMD = 0;
        computeYMD(&y);
        if( cf=='g' ){
          sqlite3_str_appendf(&sRes, "%02d", y.Y%100);
        }else{
          sqlite3_str_appendf(&sRes, "%04d", y.Y);
        }
        break;
      }
      case 'H':
      case 'k': {
        sqlite3_str_appendf(&sRes, cf=='H' ? "%02d" : "%2d", x.h);
        break;
      }
      case 'I': /* Fall thru */
      case 'l': {
        int h = x.h;
        if( h>12 ) h -= 12;
        if( h==0 ) h = 12;
        sqlite3_str_appendf(&sRes, cf=='I' ? "%02d" : "%2d", h);
        break;
      }
      case 'j': {  /* Day of year.  Jan01==1, Jan02==2, and so forth */
        sqlite3_str_appendf(&sRes,"%03d",daysAfterJan01(&x)+1);
        break;
      }
      case 'J': {  /* Julian day number.  (Non-standard) */
        sqlite3_str_appendf(&sRes,"%.16g",x.iJD/86400000.0);
        break;
      }
      case 'm': {
        sqlite3_str_appendf(&sRes,"%02d",x.M);
        break;
      }
      case 'M': {
        sqlite3_str_appendf(&sRes,"%02d",x.m);
        break;
      }
      case 'p': /* Fall thru */
      case 'P': {
        if( x.h>=12 ){
          sqlite3_str_append(&sRes, cf=='p' ? "PM" : "pm", 2);
        }else{
          sqlite3_str_append(&sRes, cf=='p' ? "AM" : "am", 2);
        }
        break;
      }
      case 'R': {
        sqlite3_str_appendf(&sRes, "%02d:%02d", x.h, x.m);
        break;
      }
      case 's': {
        if( x.useSubsec ){
          sqlite3_str_appendf(&sRes,"%.3f",
                (x.iJD - 21086676*(i64)10000000)/1000.0);
        }else{
          i64 iS = (i64)(x.iJD/1000 - 21086676*(i64)10000);
          sqlite3_str_appendf(&sRes,"%lld",iS);
        }
        break;
      }
      case 'S': {
        sqlite3_str_appendf(&sRes,"%02d",(int)x.s);
        break;
      }
      case 'T': {
        sqlite3_str_appendf(&sRes,"%02d:%02d:%02d", x.h, x.m, (int)x.s);
        break;
      }
      case 'u':    /* Day of week.  1 to 7.  Monday==1, Sunday==7 */
      case 'w': {  /* Day of week.  0 to 6.  Sunday==0, Monday==1 */
        char c = (char)daysAfterSunday(&x) + '0';
        if( c=='0' && cf=='u' ) c = '7';
        sqlite3_str_appendchar(&sRes, 1, c);
        break;
      }
      case 'U': {  /* Week num. 00-53. First Sun of the year is week 01 */
        sqlite3_str_appendf(&sRes,"%02d",
              (daysAfterJan01(&x)-daysAfterSunday(&x)+7)/7);
        break;
      }
      case 'V': {  /* Week num. 01-53. First week with a Thur is week 01 */
        DateTime y = x;
        /* Adjust y so that is the Thursday in the same week as x */
        assert( y.validJD );
        y.iJD += (3 - daysAfterMonday(&x))*86400000;
        y.validYMD = 0;
        computeYMD(&y);
        sqlite3_str_appendf(&sRes,"%02d", daysAfterJan01(&y)/7+1);
        break;
      }
      case 'W': {  /* Week num. 00-53. First Mon of the year is week 01 */
        sqlite3_str_appendf(&sRes,"%02d",
           (daysAfterJan01(&x)-daysAfterMonday(&x)+7)/7);
        break;
      }
      case 'Y': {
        sqlite3_str_appendf(&sRes,"%04d",x.Y);
        break;
      }
      case '%': {
        sqlite3_str_appendchar(&sRes, 1, '%');
        break;
      }
      default: {
        sqlite3_str_reset(&sRes);
        return;
      }
    }
  }
  if( j<i ) sqlite3_str_append(&sRes, zFmt+j, (int)(i-j));
  sqlite3ResultStrAccum(context, &sRes);
}